

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extensions
          (PhysicalDeviceSelector *this,size_t count,char **extensions)

{
  size_t i;
  size_t sVar1;
  allocator<char> local_59;
  PhysicalDeviceSelector *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = this;
  if (count != 0 && extensions != (char **)0x0) {
    for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,extensions[sVar1],&local_59);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->criteria).required_extensions,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return local_58;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        criteria.required_extensions.push_back(extensions[i]);
    }
    return *this;
}